

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-cpu-aarch64.cpp
# Opt level: O3

void ggml::cpu::aarch64::gemv<block_q4_0,8l,8l,(ggml_type)8>
               (int n,float *s,size_t bs,void *vx,void *vy,int nr,int nc)

{
  undefined4 uVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  int iVar4;
  int iVar5;
  undefined1 (*pauVar6) [16];
  long lVar7;
  long lVar8;
  long lVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  
  iVar4 = n + 0x1f;
  if (-1 < n) {
    iVar4 = n;
  }
  if (0 < nr) {
    auVar13[8] = 0xf;
    auVar13._0_8_ = 0xf0f0f0f0f0f0f0f;
    auVar13[9] = 0xf;
    auVar13[10] = 0xf;
    auVar13[0xb] = 0xf;
    auVar13[0xc] = 0xf;
    auVar13[0xd] = 0xf;
    auVar13[0xe] = 0xf;
    auVar13[0xf] = 0xf;
    auVar13[0x10] = 0xf;
    auVar13[0x11] = 0xf;
    auVar13[0x12] = 0xf;
    auVar13[0x13] = 0xf;
    auVar13[0x14] = 0xf;
    auVar13[0x15] = 0xf;
    auVar13[0x16] = 0xf;
    auVar13[0x17] = 0xf;
    auVar13[0x18] = 0xf;
    auVar13[0x19] = 0xf;
    auVar13[0x1a] = 0xf;
    auVar13[0x1b] = 0xf;
    auVar13[0x1c] = 0xf;
    auVar13[0x1d] = 0xf;
    auVar13[0x1e] = 0xf;
    auVar13[0x1f] = 0xf;
    auVar14._16_16_ = _DAT_0014b3e0;
    auVar14._0_16_ = _DAT_0014b3e0;
    auVar10 = vmovdqa64_avx512vl(_DAT_0014b3d0);
    auVar11 = vpmovsxbd_avx512vl(ZEXT816(0xe060c040a020800));
    auVar12 = vpmovsxbd_avx2(ZEXT816(0xf070d050b030901));
    iVar5 = nc + 7;
    if (-1 < nc) {
      iVar5 = nc;
    }
    lVar9 = 0;
    do {
      if (7 < nc) {
        pauVar6 = (undefined1 (*) [16])vx;
        lVar7 = 0;
        do {
          if (0x1f < n) {
            uVar1 = *(undefined4 *)((long)vy + 2);
            auVar15._4_4_ = uVar1;
            auVar15._0_4_ = uVar1;
            auVar15._8_4_ = uVar1;
            auVar15._12_4_ = uVar1;
            auVar15._16_4_ = uVar1;
            auVar15._20_4_ = uVar1;
            auVar15._24_4_ = uVar1;
            auVar15._28_4_ = uVar1;
            auVar17 = vpand_avx2(*(undefined1 (*) [32])(pauVar6 + 1),auVar13);
            auVar16 = vpsrlw_avx2(*(undefined1 (*) [32])(pauVar6 + 1),4);
            auVar2 = vpshufb_avx2(auVar14,auVar17);
            auVar17 = vpand_avx2(*(undefined1 (*) [32])(pauVar6 + 3),auVar13);
            auVar16 = vpand_avx2(auVar16,auVar13);
            auVar3 = vpshufb_avx2(auVar14,auVar17);
            auVar17 = vpand_avx2(*(undefined1 (*) [32])(pauVar6 + 5),auVar13);
            vpshufb_avx2(auVar14,auVar17);
            auVar17 = vpand_avx2(*(undefined1 (*) [32])(pauVar6 + 7),auVar13);
            vpshufb_avx2(auVar14,auVar17);
            vpshufb_avx2(auVar14,auVar16);
            auVar17 = vpsrlw_avx2(*(undefined1 (*) [32])(pauVar6 + 3),4);
            auVar16 = vpsrlw_avx2(*(undefined1 (*) [32])(pauVar6 + 5),4);
            auVar17 = vpand_avx2(auVar17,auVar13);
            auVar16 = vpand_avx2(auVar16,auVar13);
            vpshufb_avx2(auVar14,auVar17);
            vpshufb_avx2(auVar14,auVar16);
            auVar17 = vpsrlw_avx2(*(undefined1 (*) [32])(pauVar6 + 7),4);
            auVar13 = vpand_avx2(auVar17,auVar13);
            vpshufb_avx2(auVar14,auVar13);
            auVar10 = vpshufb_avx512vl(*pauVar6,auVar10);
            vcvtph2ps_f16c(auVar10);
            auVar11 = vpermt2d_avx512vl(auVar2,auVar11,auVar3);
            auVar12 = vpermt2d_avx512vl(auVar2,auVar12,auVar3);
            vpsignb_avx2(auVar11,auVar11);
            vpsignb_avx2(auVar15,auVar11);
            vpsignb_avx2(auVar12,auVar12);
            halt_baddata();
          }
          auVar17 = vshufps_avx(ZEXT1632(ZEXT816(0) << 0x40),ZEXT1632(ZEXT816(0) << 0x40),0xd8);
          lVar8 = lVar7 + 1;
          pauVar6 = pauVar6 + (long)(iVar4 >> 5) * 9;
          auVar17 = vpermpd_avx2(auVar17,0xd8);
          *(undefined1 (*) [32])(s + lVar9 * nr + lVar7 * 8) = auVar17;
          lVar7 = lVar8;
        } while (lVar8 != iVar5 >> 3);
      }
      vy = (void *)((long)vy + (long)(iVar4 >> 5) * 0x22);
      lVar9 = lVar9 + 1;
    } while (lVar9 != nr);
  }
  return;
}

Assistant:

void gemv<block_q4_0, 8, 8, GGML_TYPE_Q8_0>(int n, float * s, size_t bs, const void * vx, const void * vy, int nr, int nc) {
    ggml_gemv_q4_0_8x8_q8_0(n, s, bs, vx, vy, nr, nc);
}